

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_combo_begin_image_text(nk_context *ctx,char *selected,int len,nk_image img,nk_vec2 size)

{
  nk_window *win_00;
  nk_rect r;
  nk_rect b;
  nk_rect r_00;
  nk_rect r_01;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect header_00;
  nk_widget_layout_states nVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  nk_context *local_d8;
  nk_symbol_type local_c0;
  nk_symbol_type sym;
  nk_rect image;
  nk_rect label;
  nk_rect button;
  nk_rect content;
  nk_text text;
  nk_style_item *background;
  nk_widget_layout_states s;
  int is_clicked;
  nk_rect header;
  nk_input *in;
  nk_style *style;
  nk_window *win;
  int len_local;
  char *selected_local;
  nk_context *ctx_local;
  nk_vec2 size_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x60e1,
                  "int nk_combo_begin_image_text(struct nk_context *, const char *, int, struct nk_image, struct nk_vec2)"
                 );
  }
  if (ctx->current != (nk_window *)0x0) {
    if (ctx->current->layout != (nk_panel *)0x0) {
      if (((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
         (ctx->current->layout == (nk_panel *)0x0)) {
        size_local.x = 0.0;
      }
      else {
        win_00 = ctx->current;
        nVar1 = nk_widget((nk_rect *)&s,ctx);
        if (nVar1 == NK_WIDGET_INVALID) {
          size_local.x = 0.0;
        }
        else {
          if (((win_00->layout->flags & 0x1000) != 0) || (local_d8 = ctx, nVar1 == NK_WIDGET_ROM)) {
            local_d8 = (nk_context *)0x0;
          }
          header._8_8_ = local_d8;
          r_00.y = (float)is_clicked;
          r_00.x = (float)s;
          r_00.w = header.x;
          r_00.h = header.y;
          iVar2 = nk_button_behavior(&ctx->last_widget_state,r_00,&local_d8->input,NK_BUTTON_DEFAULT
                                    );
          background._4_4_ = (uint)(iVar2 != 0);
          if ((ctx->last_widget_state & 0x20) == 0) {
            if ((ctx->last_widget_state & 0x10) == 0) {
              text._8_8_ = &(ctx->style).combo;
            }
            else {
              text._8_8_ = &(ctx->style).combo.hover;
            }
          }
          else {
            text._8_8_ = &(ctx->style).combo.active;
          }
          if (*(int *)text._8_8_ == 1) {
            content.w = (float)nk_rgba(0,0,0,0);
            r_01.y = (float)is_clicked;
            r_01.x = (float)s;
            r_01.w = header.x;
            r_01.h = header.y;
            nk_draw_image(&win_00->buffer,r_01,(nk_image *)(text._8_8_ + 8),(nk_color)0xffffffff);
          }
          else {
            rect.y = (float)is_clicked;
            rect.x = (float)s;
            rect.w = header.x;
            rect.h = header.y;
            nk_fill_rect(&win_00->buffer,rect,(ctx->style).combo.rounding,
                         *(nk_color *)(text._8_8_ + 8));
            rect_00.y = (float)is_clicked;
            rect_00.x = (float)s;
            rect_00.w = header.x;
            rect_00.h = header.y;
            nk_stroke_rect(&win_00->buffer,rect_00,(ctx->style).combo.rounding,
                           (ctx->style).combo.border,(ctx->style).combo.border_color);
          }
          if ((ctx->last_widget_state & 0x10) == 0) {
            if (background._4_4_ == 0) {
              local_c0 = (ctx->style).combo.sym_normal;
            }
            else {
              local_c0 = (ctx->style).combo.sym_active;
            }
          }
          else {
            local_c0 = (ctx->style).combo.sym_hover;
          }
          fVar4 = (ctx->style).combo.button_padding.y;
          button.x = header.y - (fVar4 + fVar4);
          label.w = (((float)s + header.x) - header.y) - (ctx->style).combo.button_padding.x;
          label.h = (float)is_clicked + (ctx->style).combo.button_padding.y;
          button.w = label.w + (ctx->style).combo.button.padding.x;
          button.h = label.h + (ctx->style).combo.button.padding.y;
          fVar4 = (ctx->style).combo.button.padding.x;
          content.x = button.x - (fVar4 + fVar4);
          fVar4 = (ctx->style).combo.button.padding.y;
          content.y = button.x - (fVar4 + fVar4);
          button.y = button.x;
          nk_draw_button_symbol
                    (&win_00->buffer,(nk_rect *)&label.w,(nk_rect *)&button.w,ctx->last_widget_state
                     ,&(ctx->style).combo.button,local_c0,(ctx->style).font);
          fVar3 = (float)s + (ctx->style).combo.content_padding.x;
          fVar4 = (ctx->style).combo.content_padding.y;
          fVar4 = header.y - (fVar4 + fVar4);
          r.y = (float)is_clicked + (ctx->style).combo.content_padding.y;
          r.x = fVar3;
          r.w = fVar4;
          r.h = fVar4;
          nk_draw_image(&win_00->buffer,r,&img,(nk_color)0xffffffff);
          register0x00001200 = nk_vec2(0.0,0.0);
          fVar3 = fVar3 + fVar4 + (ctx->style).combo.spacing.x +
                  (ctx->style).combo.content_padding.x;
          label.x = (label.w - (ctx->style).combo.content_padding.x) - fVar3;
          fVar4 = (ctx->style).combo.content_padding.y;
          label.y = header.y - (fVar4 + fVar4);
          b.y = (float)is_clicked + (ctx->style).combo.content_padding.y;
          b.x = fVar3;
          b.w = label.x;
          b.h = label.y;
          nk_widget_text(&win_00->buffer,b,selected,len,(nk_text *)&content.h,0x11,(ctx->style).font
                        );
          header_00.y = (float)is_clicked;
          header_00.x = (float)s;
          header_00.w = header.x;
          header_00.h = header.y;
          size_local.x = (float)nk_combo_begin(ctx,win_00,size,background._4_4_,header_00);
        }
      }
      return (int)size_local.x;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x60e3,
                  "int nk_combo_begin_image_text(struct nk_context *, const char *, int, struct nk_image, struct nk_vec2)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x60e2,
                "int nk_combo_begin_image_text(struct nk_context *, const char *, int, struct nk_image, struct nk_vec2)"
               );
}

Assistant:

NK_API int
nk_combo_begin_image_text(struct nk_context *ctx, const char *selected, int len,
    struct nk_image img, struct nk_vec2 size)
{
    struct nk_window *win;
    struct nk_style *style;
    struct nk_input *in;

    struct nk_rect header;
    int is_clicked = nk_false;
    enum nk_widget_layout_states s;
    const struct nk_style_item *background;
    struct nk_text text;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    s = nk_widget(&header, ctx);
    if (!s) return 0;

    in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
    if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
        is_clicked = nk_true;

    /* draw combo box header background and border */
    if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED) {
        background = &style->combo.active;
        text.text = style->combo.label_active;
    } else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER) {
        background = &style->combo.hover;
        text.text = style->combo.label_hover;
    } else {
        background = &style->combo.normal;
        text.text = style->combo.label_normal;
    }
    if (background->type == NK_STYLE_ITEM_IMAGE) {
        text.background = nk_rgba(0,0,0,0);
        nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
    } else {
        text.background = background->data.color;
        nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
        nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
    }
    {
        struct nk_rect content;
        struct nk_rect button;
        struct nk_rect label;
        struct nk_rect image;

        enum nk_symbol_type sym;
        if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
            sym = style->combo.sym_hover;
        else if (is_clicked)
            sym = style->combo.sym_active;
        else sym = style->combo.sym_normal;

        /* calculate button */
        button.w = header.h - 2 * style->combo.button_padding.y;
        button.x = (header.x + header.w - header.h) - style->combo.button_padding.x;
        button.y = header.y + style->combo.button_padding.y;
        button.h = button.w;

        content.x = button.x + style->combo.button.padding.x;
        content.y = button.y + style->combo.button.padding.y;
        content.w = button.w - 2 * style->combo.button.padding.x;
        content.h = button.h - 2 * style->combo.button.padding.y;
        nk_draw_button_symbol(&win->buffer, &button, &content, ctx->last_widget_state,
            &ctx->style.combo.button, sym, style->font);

        /* draw image */
        image.x = header.x + style->combo.content_padding.x;
        image.y = header.y + style->combo.content_padding.y;
        image.h = header.h - 2 * style->combo.content_padding.y;
        image.w = image.h;
        nk_draw_image(&win->buffer, image, &img, nk_white);

        /* draw label */
        text.padding = nk_vec2(0,0);
        label.x = image.x + image.w + style->combo.spacing.x + style->combo.content_padding.x;
        label.y = header.y + style->combo.content_padding.y;
        label.w = (button.x - style->combo.content_padding.x) - label.x;
        label.h = header.h - 2 * style->combo.content_padding.y;
        nk_widget_text(&win->buffer, label, selected, len, &text, NK_TEXT_LEFT, style->font);
    }
    return nk_combo_begin(ctx, win, size, is_clicked, header);
}